

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeSharedArrayBufferConstructor
               (DynamicObject *sharedArrayBufferConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  RuntimeFunction *pRVar1;
  RuntimeFunction *pRVar2;
  PropertyString *pPVar3;
  
  DeferredTypeHandlerBase::Convert(typeHandler,sharedArrayBufferConstructor,mode,4,0);
  this = (((sharedArrayBufferConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(sharedArrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (sharedArrayBufferConstructor,0xd1,&DAT_1000000000001,2,0,0,0);
  (*(sharedArrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (sharedArrayBufferConstructor,0x124,
             (((this_00->super_ScriptContextBase).javascriptLibrary)->sharedArrayBufferPrototype).
             ptr,0,0,0,0);
  pRVar2 = CreateGetterFunction
                     (this,0x2c6,(FunctionInfo *)SharedArrayBuffer::EntryInfo::GetterSymbolSpecies);
  pRVar1 = (RuntimeFunction *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (pRVar2 == (RuntimeFunction *)0x0) {
    pRVar2 = pRVar1;
  }
  (*(sharedArrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2d])
            (sharedArrayBufferConstructor,0x19,pRVar2,pRVar1,0);
  (*(sharedArrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e])
            (sharedArrayBufferConstructor,0x19,6);
  pPVar3 = ScriptContext::GetPropertyString(this_00,0x2cb);
  (*(sharedArrayBufferConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (sharedArrayBufferConstructor,0x106,pPVar3,2,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(sharedArrayBufferConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSharedArrayBufferConstructor(DynamicObject* sharedArrayBufferConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(sharedArrayBufferConstructor, mode, 4);

        ScriptContext* scriptContext = sharedArrayBufferConstructor->GetScriptContext();
        JavascriptLibrary* library = sharedArrayBufferConstructor->GetLibrary();
        library->AddMember(sharedArrayBufferConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(sharedArrayBufferConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->sharedArrayBufferPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(sharedArrayBufferConstructor, &SharedArrayBuffer::EntryInfo::GetterSymbolSpecies);
        library->AddMember(sharedArrayBufferConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::SharedArrayBuffer), PropertyConfigurable);

        sharedArrayBufferConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }